

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string *python_dict_name)

{
  FileDescriptor *pFVar1;
  LogMessage *pLVar2;
  string *psVar3;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  string local_f8;
  SubstituteArg local_d8;
  allocator local_a1;
  string local_a0;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  string *local_30;
  string *python_dict_name_local;
  FieldDescriptor *field_local;
  Descriptor *containing_type_local;
  Generator *this_local;
  
  local_30 = python_dict_name;
  python_dict_name_local = (string *)field;
  field_local = (FieldDescriptor *)containing_type;
  containing_type_local = (Descriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  pFVar1 = FieldDescriptor::file(field);
  local_69 = 0;
  if (pFVar1 != this->file_) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x434);
    local_69 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (field.file()) == (file_): ")
    ;
    pFVar1 = FieldDescriptor::file((FieldDescriptor *)python_dict_name_local);
    psVar3 = FileDescriptor::name_abi_cxx11_(pFVar1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," vs. ");
    psVar3 = FileDescriptor::name_abi_cxx11_(this->file_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
    internal::LogFinisher::operator=(local_7d,pLVar2);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (field_local == (FieldDescriptor *)0x0) {
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)python_dict_name_local);
    anon_unknown_0::ResolveKeyword(__return_storage_ptr__,psVar3);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"$0.$1[\'$2\']",&local_a1);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_f8,this,(Descriptor *)field_local);
    strings::internal::SubstituteArg::SubstituteArg(&local_d8,&local_f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_128,local_30);
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)python_dict_name_local);
    strings::internal::SubstituteArg::SubstituteArg(&local_158,psVar3);
    strings::internal::SubstituteArg::SubstituteArg(&local_188);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_218);
    strings::internal::SubstituteArg::SubstituteArg(&local_248);
    strings::internal::SubstituteArg::SubstituteArg(&local_278);
    strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
    strings::Substitute(__return_storage_ptr__,&local_a0,&local_d8,&local_128,&local_158,&local_188,
                        &local_1b8,&local_1e8,&local_218,&local_248,&local_278,&local_2a8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::FieldReferencingExpression(
    const Descriptor* containing_type, const FieldDescriptor& field,
    const std::string& python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  GOOGLE_CHECK_EQ(field.file(), file_)
      << field.file()->name() << " vs. " << file_->name();
  if (!containing_type) {
    return ResolveKeyword(field.name());
  }
  return strings::Substitute("$0.$1['$2']",
                          ModuleLevelDescriptorName(*containing_type),
                          python_dict_name, field.name());
}